

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrohash128.cpp
# Opt level: O1

void __thiscall MetroHash128::Finalize(MetroHash128 *this,uint8_t *hash)

{
  uint8_t *puVar1;
  uint64_t uVar2;
  long lVar3;
  ulong uVar4;
  uint64_t uVar5;
  anon_struct_32_1_54a39802_for_input *paVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  uVar9 = this->bytes;
  if (0x1f < uVar9) {
    uVar4 = (this->state).v[3];
    auVar13 = *(undefined1 (*) [16])(this->state).v;
    uVar5 = (this->state).v[0];
    uVar2 = (this->state).v[1];
    uVar7 = (uVar4 + uVar5) * 0xc83a91e1 + uVar2;
    uVar8 = (uVar7 >> 0x15 | uVar7 << 0x2b) * 0x8648dbdb ^ (this->state).v[2];
    (this->state).v[2] = uVar8;
    uVar7 = (uVar2 + uVar8) * 0x8648dbdb + uVar5;
    uVar4 = (uVar7 >> 0x15 | uVar7 << 0x2b) * 0xc83a91e1 ^ uVar4;
    (this->state).v[3] = uVar4;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar8;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar4;
    auVar14 = vpunpcklqdq_avx(auVar12,auVar14);
    auVar12 = vpaddq_avx(auVar14,auVar13);
    auVar11 = vpmullq_avx512vl(auVar12,_DAT_001a7a10);
    auVar12 = vpshufd_avx(auVar14,0x4e);
    auVar12 = vpaddq_avx(auVar12,auVar11);
    auVar12 = vprolq_avx512vl(auVar12,0x2b);
    auVar12 = vpmullq_avx512vl(auVar12,_DAT_001a7ad0);
    *(undefined1 (*) [16])(this->state).v = auVar12 ^ auVar13;
  }
  uVar9 = (ulong)((uint)uVar9 & 0x1f);
  puVar1 = (this->input).b + uVar9;
  if (uVar9 < 0x10) {
    paVar6 = &this->input;
  }
  else {
    paVar6 = (anon_struct_32_1_54a39802_for_input *)((this->input).b + 0x10);
    auVar13._8_8_ = 0x7bdec03b;
    auVar13._0_8_ = 0x7bdec03b;
    auVar13 = vpmullq_avx512vl(*(undefined1 (*) [16])(this->input).b,auVar13);
    auVar13 = vpaddq_avx(auVar13,*(undefined1 (*) [16])(this->state).v);
    auVar13 = vprolq_avx512vl(auVar13,0x1f);
    auVar11._8_8_ = 0x2f5870a5;
    auVar11._0_8_ = 0x2f5870a5;
    auVar12 = vpmullq_avx512vl(auVar13,auVar11);
    *(undefined1 (*) [16])(this->state).v = auVar12;
    uVar4 = vpextrq_avx(auVar12,1);
    uVar9 = auVar13._0_8_ * 0x16e8b05e33f3b607 + uVar4;
    uVar9 = auVar12._0_8_ ^ (uVar9 >> 0x2d | uVar9 * 0x80000) * 0x8648dbdb;
    (this->state).v[0] = uVar9;
    lVar10 = vpextrq_avx(auVar13,1);
    uVar9 = lVar10 * 0x8c197ea3900ca59 + uVar9;
    (this->state).v[1] = (uVar9 >> 0x2d | uVar9 * 0x80000) * 0xc83a91e1 ^ uVar4;
  }
  if (7 < (long)puVar1 - (long)paVar6) {
    uVar9 = *(long *)paVar6->b * 0x7bdec03b + (this->state).v[0];
    paVar6 = (anon_struct_32_1_54a39802_for_input *)(paVar6->b + 8);
    uVar9 = uVar9 >> 0x21 | uVar9 * 0x80000000;
    uVar4 = uVar9 * 0x16e8b05e33f3b607 + (this->state).v[1];
    (this->state).v[0] = (uVar4 >> 0x1b | uVar4 << 0x25) * 0x8648dbdb ^ uVar9 * 0x2f5870a5;
  }
  if (3 < (long)puVar1 - (long)paVar6) {
    uVar9 = (ulong)*(uint *)paVar6->b * 0x7bdec03b + (this->state).v[1];
    paVar6 = (anon_struct_32_1_54a39802_for_input *)(paVar6->b + 4);
    uVar9 = uVar9 >> 0x21 | uVar9 * 0x80000000;
    uVar4 = uVar9 * 0x8c197ea3900ca59 + (this->state).v[0];
    (this->state).v[1] = (uVar4 >> 0x2e | uVar4 * 0x40000) * 0xc83a91e1 ^ uVar9 * 0x2f5870a5;
  }
  if (1 < (long)puVar1 - (long)paVar6) {
    uVar9 = (ulong)*(ushort *)paVar6->b * 0x7bdec03b + (this->state).v[0];
    paVar6 = (anon_struct_32_1_54a39802_for_input *)(paVar6->b + 2);
    uVar4 = uVar9 >> 0x21 | uVar9 * 0x80000000;
    uVar9 = uVar4 * 0x16e8b05e33f3b607 + (this->state).v[1];
    (this->state).v[0] = (uVar9 >> 0x16 | uVar9 << 0x2a) * 0x8648dbdb ^ uVar4 * 0x2f5870a5;
  }
  if ((anon_struct_32_1_54a39802_for_input *)puVar1 != paVar6 && -1 < (long)puVar1 - (long)paVar6) {
    uVar9 = (ulong)paVar6->b[0] * 0x7bdec03b + (this->state).v[1];
    uVar4 = uVar9 >> 0x21 | uVar9 * 0x80000000;
    uVar9 = uVar4 * 0x8c197ea3900ca59 + (this->state).v[0];
    (this->state).v[1] = (uVar9 >> 0x3a | uVar9 * 0x40) * 0xc83a91e1 ^ uVar4 * 0x2f5870a5;
  }
  uVar5 = (this->state).v[0];
  uVar2 = (this->state).v[1];
  uVar9 = uVar5 * 0xc83a91e1 + uVar2;
  lVar3 = (uVar9 >> 0xd | uVar9 << 0x33) + uVar5;
  uVar9 = uVar2 * 0x8648dbdb + lVar3;
  lVar10 = (uVar9 >> 0x25 | uVar9 * 0x8000000) + uVar2;
  uVar9 = lVar3 * 0x7bdec03b + lVar10;
  uVar5 = (uVar9 >> 0xd | uVar9 << 0x33) + lVar3;
  (this->state).v[0] = uVar5;
  uVar9 = lVar10 * 0x2f5870a5 + uVar5;
  (this->state).v[1] = (uVar9 >> 0x25 | uVar9 * 0x8000000) + lVar10;
  this->bytes = 0;
  uVar5 = (this->state).v[1];
  *(uint64_t *)hash = (this->state).v[0];
  *(uint64_t *)(hash + 8) = uVar5;
  return;
}

Assistant:

void MetroHash128::Finalize(uint8_t * const hash)
{
    // finalize bulk loop, if used
    if (bytes >= 32)
    {
        state.v[2] ^= rotate_right(((state.v[0] + state.v[3]) * k0) + state.v[1], 21) * k1;
        state.v[3] ^= rotate_right(((state.v[1] + state.v[2]) * k1) + state.v[0], 21) * k0;
        state.v[0] ^= rotate_right(((state.v[0] + state.v[2]) * k0) + state.v[3], 21) * k1;
        state.v[1] ^= rotate_right(((state.v[1] + state.v[3]) * k1) + state.v[2], 21) * k0;
    }
    
    // process any bytes remaining in the input buffer
    const uint8_t * ptr = reinterpret_cast<const uint8_t*>(input.b);
    const uint8_t * const end = ptr + (bytes % 32);
    
    if ((end - ptr) >= 16)
    {
        state.v[0] += read_u64(ptr) * k2; ptr += 8; state.v[0] = rotate_right(state.v[0],33) * k3;
        state.v[1] += read_u64(ptr) * k2; ptr += 8; state.v[1] = rotate_right(state.v[1],33) * k3;
        state.v[0] ^= rotate_right((state.v[0] * k2) + state.v[1], 45) * k1;
        state.v[1] ^= rotate_right((state.v[1] * k3) + state.v[0], 45) * k0;
    }

    if ((end - ptr) >= 8)
    {
        state.v[0] += read_u64(ptr) * k2; ptr += 8; state.v[0] = rotate_right(state.v[0],33) * k3;
        state.v[0] ^= rotate_right((state.v[0] * k2) + state.v[1], 27) * k1;
    }

    if ((end - ptr) >= 4)
    {
        state.v[1] += read_u32(ptr) * k2; ptr += 4; state.v[1] = rotate_right(state.v[1],33) * k3;
        state.v[1] ^= rotate_right((state.v[1] * k3) + state.v[0], 46) * k0;
    }

    if ((end - ptr) >= 2)
    {
        state.v[0] += read_u16(ptr) * k2; ptr += 2; state.v[0] = rotate_right(state.v[0],33) * k3;
        state.v[0] ^= rotate_right((state.v[0] * k2) + state.v[1], 22) * k1;
    }

    if ((end - ptr) >= 1)
    {
        state.v[1] += read_u8 (ptr) * k2; state.v[1] = rotate_right(state.v[1],33) * k3;
        state.v[1] ^= rotate_right((state.v[1] * k3) + state.v[0], 58) * k0;
    }
    
    state.v[0] += rotate_right((state.v[0] * k0) + state.v[1], 13);
    state.v[1] += rotate_right((state.v[1] * k1) + state.v[0], 37);
    state.v[0] += rotate_right((state.v[0] * k2) + state.v[1], 13);
    state.v[1] += rotate_right((state.v[1] * k3) + state.v[0], 37);

    bytes = 0;

    // do any endian conversion here

    memcpy(hash, state.v, 16);
}